

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

mbedtls_mpi_uint
mbedtls_mpi_core_mla
          (mbedtls_mpi_uint *d,size_t d_len,mbedtls_mpi_uint *s,size_t s_len,mbedtls_mpi_uint b)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  
  if (d_len < s_len) {
    s_len = d_len;
  }
  uVar25 = s_len >> 3;
  uVar24 = 0;
  while (bVar26 = uVar25 != 0, uVar25 = uVar25 - 1, bVar26) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = b;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *s;
    uVar20 = SUB168(auVar2 * auVar11,0);
    uVar23 = uVar24 + uVar20;
    uVar21 = *d;
    *d = *d + uVar23;
    uVar23 = (ulong)CARRY8(uVar24,uVar20) + SUB168(auVar2 * auVar11,8) +
             (ulong)CARRY8(uVar21,uVar23);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = b;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = s[1];
    uVar21 = SUB168(auVar3 * auVar12,0);
    uVar20 = uVar21 + uVar23;
    puVar1 = d + 1;
    uVar24 = *puVar1;
    *puVar1 = *puVar1 + uVar20;
    uVar23 = (ulong)CARRY8(uVar21,uVar23) + SUB168(auVar3 * auVar12,8) +
             (ulong)CARRY8(uVar24,uVar20);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = b;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = s[2];
    uVar21 = SUB168(auVar4 * auVar13,0);
    uVar20 = uVar21 + uVar23;
    puVar1 = d + 2;
    uVar24 = *puVar1;
    *puVar1 = *puVar1 + uVar20;
    uVar23 = (ulong)CARRY8(uVar21,uVar23) + SUB168(auVar4 * auVar13,8) +
             (ulong)CARRY8(uVar24,uVar20);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = b;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = s[3];
    uVar21 = SUB168(auVar5 * auVar14,0);
    uVar20 = uVar21 + uVar23;
    puVar1 = d + 3;
    uVar24 = *puVar1;
    *puVar1 = *puVar1 + uVar20;
    uVar23 = (ulong)CARRY8(uVar21,uVar23) + SUB168(auVar5 * auVar14,8) +
             (ulong)CARRY8(uVar24,uVar20);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = b;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = s[4];
    uVar21 = SUB168(auVar6 * auVar15,0);
    uVar20 = uVar21 + uVar23;
    puVar1 = d + 4;
    uVar24 = *puVar1;
    *puVar1 = *puVar1 + uVar20;
    uVar23 = (ulong)CARRY8(uVar21,uVar23) + SUB168(auVar6 * auVar15,8) +
             (ulong)CARRY8(uVar24,uVar20);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = b;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = s[5];
    uVar21 = SUB168(auVar7 * auVar16,0);
    uVar20 = uVar21 + uVar23;
    puVar1 = d + 5;
    uVar24 = *puVar1;
    *puVar1 = *puVar1 + uVar20;
    uVar23 = (ulong)CARRY8(uVar21,uVar23) + SUB168(auVar7 * auVar16,8) +
             (ulong)CARRY8(uVar24,uVar20);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = b;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = s[6];
    uVar21 = SUB168(auVar8 * auVar17,0);
    uVar20 = uVar21 + uVar23;
    puVar1 = d + 6;
    uVar24 = *puVar1;
    *puVar1 = *puVar1 + uVar20;
    uVar23 = (ulong)CARRY8(uVar21,uVar23) + SUB168(auVar8 * auVar17,8) +
             (ulong)CARRY8(uVar24,uVar20);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = b;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = s[7];
    uVar21 = SUB168(auVar9 * auVar18,0);
    s = s + 8;
    uVar20 = uVar21 + uVar23;
    puVar1 = d + 7;
    uVar24 = *puVar1;
    *puVar1 = *puVar1 + uVar20;
    uVar24 = (ulong)CARRY8(uVar21,uVar23) + SUB168(auVar9 * auVar18,8) +
             (ulong)CARRY8(uVar24,uVar20);
    d = d + 8;
  }
  for (uVar25 = 0; ((uint)s_len & 7) << 3 != uVar25; uVar25 = uVar25 + 8) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = b;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)((long)s + uVar25);
    uVar20 = SUB168(auVar10 * auVar19,0);
    uVar23 = uVar24 + uVar20;
    puVar1 = (ulong *)((long)d + uVar25);
    uVar21 = *puVar1;
    *puVar1 = *puVar1 + uVar23;
    uVar24 = (ulong)CARRY8(uVar24,uVar20) + SUB168(auVar10 * auVar19,8) +
             (ulong)CARRY8(uVar21,uVar23);
  }
  for (lVar22 = 0; d_len - s_len != lVar22; lVar22 = lVar22 + 1) {
    puVar1 = (ulong *)((long)d + lVar22 * 8 + uVar25);
    uVar21 = *puVar1;
    *puVar1 = *puVar1 + uVar24;
    uVar24 = (ulong)CARRY8(uVar21,uVar24);
  }
  return uVar24;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_mla(mbedtls_mpi_uint *d, size_t d_len,
                                      const mbedtls_mpi_uint *s, size_t s_len,
                                      mbedtls_mpi_uint b)
{
    mbedtls_mpi_uint c = 0; /* carry */
    /*
     * It is a documented precondition of this function that d_len >= s_len.
     * If that's not the case, we swap these round: this turns what would be
     * a buffer overflow into an incorrect result.
     */
    if (d_len < s_len) {
        s_len = d_len;
    }
    size_t excess_len = d_len - s_len;
    size_t steps_x8 = s_len / 8;
    size_t steps_x1 = s_len & 7;

    while (steps_x8--) {
        MULADDC_X8_INIT
        MULADDC_X8_CORE
            MULADDC_X8_STOP
    }

    while (steps_x1--) {
        MULADDC_X1_INIT
        MULADDC_X1_CORE
            MULADDC_X1_STOP
    }

    while (excess_len--) {
        *d += c;
        c = (*d < c);
        d++;
    }

    return c;
}